

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

intb __thiscall TokenField::getValue(TokenField *this,ParserWalker *walker)

{
  intb iVar1;
  intb local_20;
  intb res;
  ParserWalker *walker_local;
  TokenField *this_local;
  
  res = (intb)walker;
  walker_local = (ParserWalker *)this;
  iVar1 = getInstructionBytes(walker,this->bytestart,this->byteend,(bool)(this->bigendian & 1));
  local_20 = iVar1 >> ((byte)this->shift & 0x3f);
  if ((this->signbit & 1U) == 0) {
    zero_extend(&local_20,this->bitend - this->bitstart);
  }
  else {
    sign_extend(&local_20,this->bitend - this->bitstart);
  }
  return local_20;
}

Assistant:

intb TokenField::getValue(ParserWalker &walker) const

{				// Construct value given specific instruction stream
  intb res = getInstructionBytes(walker,bytestart,byteend,bigendian);
  
  res >>= shift;
  if (signbit)
    sign_extend(res,bitend-bitstart);
  else
    zero_extend(res,bitend-bitstart);
  return res;
}